

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fingergeometry.cpp
# Opt level: O2

int QtMWidgets::FingerGeometry::height(void)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  if (height()::h == '\0') {
    iVar1 = __cxa_guard_acquire(&height()::h);
    if (iVar1 != 0) {
      QGuiApplication::primaryScreen();
      dVar2 = (double)QScreen::logicalDotsPerInchY();
      QGuiApplication::primaryScreen();
      dVar3 = (double)QScreen::physicalDotsPerInchY();
      if (dVar3 <= dVar2) {
        dVar3 = dVar2;
      }
      height::h = (int)((double)((ulong)(dVar3 * 0.393700787) & 0x8000000000000000 |
                                (ulong)DAT_001873c0) + dVar3 * 0.393700787);
      __cxa_guard_release(&height()::h);
    }
  }
  return height::h;
}

Assistant:

int
FingerGeometry::height()
{
#ifdef Q_OS_ANDROID

	static const int h =
		qRound( qgetenv( "QT_ANDROID_THEME_DISPLAY_DPI" ).toDouble() *
			fingerSize );

	return h;

#else

	static const int h =
		qRound(
			(qreal) qMax( QApplication::primaryScreen()->logicalDotsPerInchY(),
				QApplication::primaryScreen()->physicalDotsPerInchY() ) *
			fingerSize );

	return h;

#endif
}